

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

APFloat * llvm::APFloat::getAllOnesValue(APFloat *__return_storage_ptr__,uint BitWidth,bool isIEEE)

{
  undefined7 in_register_00000011;
  undefined1 *Sem;
  anon_union_8_2_1313ab2f_for_U local_20;
  uint local_18;
  
  if ((int)CONCAT71(in_register_00000011,isIEEE) == 0) {
    if (BitWidth != 0x80) {
      __assert_fail("BitWidth == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x1189,"static APFloat llvm::APFloat::getAllOnesValue(unsigned int, bool)");
    }
    local_18 = 0x80;
    APInt::initSlowCase((APInt *)&local_20,0xffffffffffffffff,true);
    detail::DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)&(__return_storage_ptr__->U).IEEE,(fltSemantics *)semPPCDoubleDouble
               ,(APInt *)&local_20);
  }
  else {
    switch(BitWidth << 0x1c | BitWidth - 0x10 >> 4) {
    case 0:
      APInt::APInt((APInt *)&local_20,BitWidth,0xffffffffffffffff,true);
      Sem = semIEEEhalf;
      break;
    case 1:
      APInt::APInt((APInt *)&local_20,BitWidth,0xffffffffffffffff,true);
      Sem = semIEEEsingle;
      break;
    default:
      llvm_unreachable_internal
                ("Unknown floating bit width",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0x1186);
    case 3:
      APInt::APInt((APInt *)&local_20,BitWidth,0xffffffffffffffff,true);
      Sem = semIEEEdouble;
      break;
    case 4:
      APInt::APInt((APInt *)&local_20,BitWidth,0xffffffffffffffff,true);
      Sem = semX87DoubleExtended;
      break;
    case 7:
      APInt::APInt((APInt *)&local_20,BitWidth,0xffffffffffffffff,true);
      Sem = semIEEEquad;
    }
    detail::IEEEFloat::IEEEFloat
              (&(__return_storage_ptr__->U).IEEE,(fltSemantics *)Sem,(APInt *)&local_20);
  }
  if ((0x40 < local_18) && ((void *)local_20.VAL != (void *)0x0)) {
    operator_delete__(local_20.pVal);
  }
  return __return_storage_ptr__;
}

Assistant:

APFloat APFloat::getAllOnesValue(unsigned BitWidth, bool isIEEE) {
  if (isIEEE) {
    switch (BitWidth) {
    case 16:
      return APFloat(semIEEEhalf, APInt::getAllOnesValue(BitWidth));
    case 32:
      return APFloat(semIEEEsingle, APInt::getAllOnesValue(BitWidth));
    case 64:
      return APFloat(semIEEEdouble, APInt::getAllOnesValue(BitWidth));
    case 80:
      return APFloat(semX87DoubleExtended, APInt::getAllOnesValue(BitWidth));
    case 128:
      return APFloat(semIEEEquad, APInt::getAllOnesValue(BitWidth));
    default:
      llvm_unreachable("Unknown floating bit width");
    }
  } else {
    assert(BitWidth == 128);
    return APFloat(semPPCDoubleDouble, APInt::getAllOnesValue(BitWidth));
  }
}